

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueMatrixCase::test(UniformValueMatrixCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  float fVar2;
  RenderContext *renderCtx;
  TestContext *pTVar3;
  bool bVar4;
  GLint GVar5;
  long lVar6;
  long lVar7;
  value_type *pvVar8;
  GLfloat *pGVar9;
  float matrixValues [16];
  StateQueryMemoryWriteGuard<float[4]> state;
  ShaderProgram program;
  ProgramSources sources;
  value_type local_388;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined1 local_348 [32];
  float local_328;
  undefined1 auStack_324 [4];
  float afStack_320 [6];
  float local_308 [34];
  ShaderProgram local_280;
  undefined1 local_1b0 [120];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  pGVar9 = (GLfloat *)(local_348 + 0x10);
  local_348._0_8_ = pGVar9;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,
             "uniform highp mat2 mat2Uniform;uniform highp mat3 mat3Uniform;uniform highp mat4 mat4Uniform;void main (void)\n{\n\tgl_Position = vec4(mat2Uniform[0][0] + mat3Uniform[0][0] + mat4Uniform[0][0]);\n}\n"
             ,"");
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"void main (void)\n{\n\tgl_FragColor = vec4(0.0);\n}\n","");
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1b0,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b0,(value_type *)local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + 0x18),&local_388);
  glu::ShaderProgram::ShaderProgram(&local_280,renderCtx,(ProgramSources *)local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((GLfloat *)local_348._0_8_ != pGVar9) {
    operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
  }
  if (local_280.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&local_280);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,local_280.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    local_358 = 0x4282000042240000;
    uStack_350 = 0x4143333340800000;
    local_368 = 0x3f8ccccdc25c6666;
    uStack_360 = 0x4198000042c40000;
    local_388.field_2._M_allocated_capacity = 0x425c000041500000;
    local_388.field_2._8_8_ = 0x42b6000041400000;
    local_388._M_dataplus._M_p = (pointer)0x3dcccccdbf800000;
    local_388._M_string_length = 0x4448000040800000;
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_280.m_program.m_program,"mat2Uniform");
    pvVar8 = &local_388;
    glu::CallLogWrapper::glUniformMatrix2fv(this_00,GVar5,1,'\0',(GLfloat *)pvVar8);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    local_328 = -8.0297587e+18;
    auStack_324 = (undefined1  [4])0xdededede;
    afStack_320[0] = -8.0297587e+18;
    afStack_320[1] = -8.0297587e+18;
    local_348._16_8_ = 0xdededededededede;
    local_348._24_8_ = 0xdededededededede;
    local_348._0_8_ = (pointer)0xdededededededede;
    local_348._8_8_ = 0xdededededededede;
    glu::CallLogWrapper::glGetUniformfv(this_00,local_280.m_program.m_program,GVar5,pGVar9);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float[4]> *)local_348,pTVar3);
    if (bVar4) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      lVar6 = 0;
      do {
        lVar7 = 0;
        do {
          fVar2 = *(GLfloat *)((long)&(pvVar8->_M_dataplus)._M_p + lVar7 * 4);
          if ((fVar2 != pGVar9[lVar7]) || (NAN(fVar2) || NAN(pGVar9[lVar7]))) {
            local_1b0._0_8_ = pTVar3->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// ERROR: at index [",0x14);
            std::ostream::operator<<(poVar1,(int)lVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
            std::ostream::operator<<(poVar1,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] expected ",0xb);
            std::ostream::_M_insert<double>
                      ((double)*(GLfloat *)((long)&(pvVar8->_M_dataplus)._M_p + lVar7 * 4));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
            std::ostream::_M_insert<double>((double)pGVar9[lVar7]);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        (pTVar3,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 2);
        lVar6 = lVar6 + 1;
        pGVar9 = pGVar9 + 2;
        pvVar8 = (value_type *)&pvVar8->_M_string_length;
      } while (lVar6 != 2);
    }
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_280.m_program.m_program,"mat3Uniform");
    pvVar8 = &local_388;
    glu::CallLogWrapper::glUniformMatrix3fv(this_00,GVar5,1,'\0',(GLfloat *)pvVar8);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pGVar9 = (GLfloat *)auStack_324;
    local_308[8] = -8.0297587e+18;
    local_308[9] = -8.0297587e+18;
    local_308[10] = -8.0297587e+18;
    local_308[4] = -8.0297587e+18;
    local_308[5] = -8.0297587e+18;
    local_308[6] = -8.0297587e+18;
    local_308[7] = -8.0297587e+18;
    local_308[0] = -8.0297587e+18;
    local_308[1] = -8.0297587e+18;
    local_308[2] = -8.0297587e+18;
    local_308[3] = -8.0297587e+18;
    afStack_320[2] = -8.0297587e+18;
    afStack_320[3] = -8.0297587e+18;
    afStack_320[4] = -8.0297587e+18;
    afStack_320[5] = -8.0297587e+18;
    local_328 = -8.0297587e+18;
    auStack_324 = (undefined1  [4])0xdededede;
    afStack_320[0] = -8.0297587e+18;
    afStack_320[1] = -8.0297587e+18;
    local_348._16_8_ = 0xdededededededede;
    local_348._24_8_ = 0xdededededededede;
    local_348._0_8_ = (GLfloat *)0xdededededededede;
    local_348._8_8_ = 0xdededededededede;
    glu::CallLogWrapper::glGetUniformfv(this_00,local_280.m_program.m_program,GVar5,pGVar9);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[9]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float[9]> *)local_348,pTVar3);
    if (bVar4) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      lVar6 = 0;
      do {
        lVar7 = 0;
        do {
          fVar2 = *(GLfloat *)((long)&(pvVar8->_M_dataplus)._M_p + lVar7 * 4);
          if ((fVar2 != pGVar9[lVar7]) || (NAN(fVar2) || NAN(pGVar9[lVar7]))) {
            local_1b0._0_8_ = pTVar3->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// ERROR: at index [",0x14);
            std::ostream::operator<<(poVar1,(int)lVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
            std::ostream::operator<<(poVar1,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] expected ",0xb);
            std::ostream::_M_insert<double>
                      ((double)*(GLfloat *)((long)&(pvVar8->_M_dataplus)._M_p + lVar7 * 4));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
            std::ostream::_M_insert<double>((double)pGVar9[lVar7]);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        (pTVar3,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar6 = lVar6 + 1;
        pGVar9 = pGVar9 + 3;
        pvVar8 = (value_type *)((long)&pvVar8->_M_string_length + 4);
      } while (lVar6 != 3);
    }
    GVar5 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_280.m_program.m_program,"mat4Uniform");
    pvVar8 = &local_388;
    glu::CallLogWrapper::glUniformMatrix4fv(this_00,GVar5,1,'\0',(GLfloat *)pvVar8);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    memset(local_348,0xde,0xc0);
    pGVar9 = local_308;
    glu::CallLogWrapper::glGetUniformfv(this_00,local_280.m_program.m_program,GVar5,pGVar9);
    bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float[16]> *)local_348,pTVar3);
    if (bVar4) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      lVar6 = 0;
      do {
        lVar7 = 0;
        do {
          fVar2 = *(GLfloat *)((long)&(pvVar8->_M_dataplus)._M_p + lVar7 * 4);
          if ((fVar2 != pGVar9[lVar7]) || (NAN(fVar2) || NAN(pGVar9[lVar7]))) {
            local_1b0._0_8_ = pTVar3->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// ERROR: at index [",0x14);
            std::ostream::operator<<(poVar1,(int)lVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
            std::ostream::operator<<(poVar1,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] expected ",0xb);
            std::ostream::_M_insert<double>
                      ((double)*(GLfloat *)((long)&(pvVar8->_M_dataplus)._M_p + lVar7 * 4));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
            std::ostream::_M_insert<double>((double)pGVar9[lVar7]);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        (pTVar3,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        lVar6 = lVar6 + 1;
        pGVar9 = pGVar9 + 4;
        pvVar8 = (value_type *)&pvVar8->field_2;
      } while (lVar6 != 4);
    }
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&local_280);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp mat2 mat2Uniform;"
			"uniform highp mat3 mat3Uniform;"
			"uniform highp mat4 mat4Uniform;"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(mat2Uniform[0][0] + mat3Uniform[0][0] + mat4Uniform[0][0]);\n"
			"}\n";
		static const char* testFragSource =

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		float matrixValues[4 * 4] =
		{
			-1.0f,	0.1f,	4.0f,	800.0f,
			13.0f,	55.0f,	12.0f,	91.0f,
			-55.1f,	1.1f,	98.0f,	19.0f,
			41.0f,	65.0f,	4.0f,	12.2f,
		};

		// the values of the matrix are returned in column major order but they can be given in either order

		location = glGetUniformLocation(program.getProgram(), "mat2Uniform");
		glUniformMatrix2fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<2>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		location = glGetUniformLocation(program.getProgram(), "mat3Uniform");
		glUniformMatrix3fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<3>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		location = glGetUniformLocation(program.getProgram(), "mat4Uniform");
		glUniformMatrix4fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<4>(m_testCtx, *this, program.getProgram(), location, matrixValues, false);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}